

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atcp.c
# Opt level: O1

void nn_atcp_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  nn_epbase *self_01;
  int iVar1;
  int extraout_EDX;
  uint extraout_EDX_00;
  int extraout_EDX_01;
  ulong uVar2;
  int val;
  size_t sz;
  undefined1 local_2c [4];
  size_t local_28;
  
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src != -2) {
LAB_0012be7d:
      nn_atcp_handler_cold_12();
      goto LAB_0012be86;
    }
    if (type == -2) {
      nn_usock_accept((nn_usock *)&self[1].state,(nn_usock *)self[8].srcptr);
      *(undefined4 *)&self[1].fn = 2;
      return;
    }
    break;
  case 2:
    if (src == 3) {
      if (type == 6) {
        self_01 = (nn_epbase *)self[1].shutdown_fn;
        iVar1 = nn_usock_geterrno((nn_usock *)self[8].srcptr);
        nn_epbase_set_error(self_01,iVar1);
        nn_epbase_stat_increment((nn_epbase *)self[1].shutdown_fn,0x6b,1);
        nn_usock_accept((nn_usock *)&self[1].state,(nn_usock *)self[8].srcptr);
        return;
      }
      goto LAB_0012beb7;
    }
    if (src != 1) goto LAB_0012be99;
    if (type == 2) {
      nn_epbase_clear_error((nn_epbase *)self[1].shutdown_fn);
      local_28 = 4;
      nn_epbase_getopt((nn_epbase *)self[1].shutdown_fn,0,2,local_2c,&local_28);
      if (local_28 == 4) {
        self_00 = &self[1].state;
        nn_usock_setsockopt((nn_usock *)self_00,1,7,local_2c,4);
        local_28 = 4;
        nn_epbase_getopt((nn_epbase *)self[1].shutdown_fn,0,3,local_2c,&local_28);
        if (local_28 == 4) {
          nn_usock_setsockopt((nn_usock *)self_00,1,8,local_2c,4);
          nn_usock_swap_owner((nn_usock *)self[8].srcptr,(nn_fsm_owner *)&self[8].owner);
          self[8].srcptr = (void *)0x0;
          *(undefined4 *)&self[8].owner = 0xffffffff;
          self[8].ctx = (nn_ctx *)0x0;
          nn_fsm_raise(self,(nn_fsm_event *)(self + 0x14),0x85b7);
          nn_usock_activate((nn_usock *)self_00);
          nn_stcp_start((nn_stcp *)&self[8].stopped,(nn_usock *)self_00);
          *(undefined4 *)&self[1].fn = 3;
          nn_epbase_stat_increment((nn_epbase *)self[1].shutdown_fn,0x66,1);
          return;
        }
      }
      else {
        nn_atcp_handler_cold_9();
      }
      nn_atcp_handler_cold_10();
      goto LAB_0012be62;
    }
    goto LAB_0012beb0;
  case 3:
    if (src != 2) {
LAB_0012be6b:
      nn_atcp_handler_cold_5();
LAB_0012be74:
      nn_atcp_handler_cold_3();
      goto LAB_0012be7d;
    }
    if (type == 1) {
      nn_stcp_stop((nn_stcp *)&self[8].stopped);
      *(undefined4 *)&self[1].fn = 4;
      nn_epbase_stat_increment((nn_epbase *)self[1].shutdown_fn,0x68,1);
      return;
    }
LAB_0012be86:
    nn_atcp_handler_cold_6();
    break;
  case 4:
    if (src != 2) goto LAB_0012be74;
    if (type == 8) {
      return;
    }
    if (type == 2) {
      nn_usock_stop((nn_usock *)&self[1].state);
      *(undefined4 *)&self[1].fn = 5;
      return;
    }
    goto LAB_0012bea9;
  case 5:
    if (src != 1) {
LAB_0012be62:
      nn_atcp_handler_cold_1();
      goto LAB_0012be6b;
    }
    if (type == 8) {
      return;
    }
    if (type == 7) {
      nn_fsm_raise(self,(nn_fsm_event *)&self[0x14].ctx,0x85b8);
      *(undefined4 *)&self[1].fn = 6;
      return;
    }
    goto LAB_0012bea2;
  default:
    goto switchD_0012bbe7_default;
  }
  nn_atcp_handler_cold_13();
switchD_0012bbe7_default:
  nn_atcp_handler_cold_14();
  type = extraout_EDX;
LAB_0012be99:
  src = type;
  nn_atcp_handler_cold_11();
LAB_0012bea2:
  nn_atcp_handler_cold_2();
LAB_0012bea9:
  nn_atcp_handler_cold_4();
LAB_0012beb0:
  nn_atcp_handler_cold_8();
  type = extraout_EDX_00;
LAB_0012beb7:
  uVar2 = (ulong)(uint)type;
  nn_atcp_handler_cold_7();
  if (extraout_EDX_01 == -3 && src == -2) goto LAB_0012bef2;
  while( true ) {
    if (*(int *)(uVar2 + 0x58) == 7) {
      iVar1 = nn_stcp_isidle((nn_stcp *)(uVar2 + 0x2f0));
      if (iVar1 == 0) {
        return;
      }
      nn_usock_stop((nn_usock *)(uVar2 + 0x68));
      *(undefined4 *)(uVar2 + 0x58) = 8;
    }
    if (*(int *)(uVar2 + 0x58) == 8) break;
    nn_atcp_shutdown_cold_2();
LAB_0012bef2:
    nn_atcp_shutdown_cold_1();
  }
  nn_atcp_shutdown_cold_3();
  return;
}

Assistant:

static void nn_atcp_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_atcp *atcp;
    int val;
    size_t sz;

    atcp = nn_cont (self, struct nn_atcp, fsm);

    switch (atcp->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_ATCP_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_usock_accept (&atcp->usock, atcp->listener);
                atcp->state = NN_ATCP_STATE_ACCEPTING;
                return;
            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  ACCEPTING state.                                                          */
/*  Waiting for incoming connection.                                          */
/******************************************************************************/
    case NN_ATCP_STATE_ACCEPTING:
        switch (src) {

        case NN_ATCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ACCEPTED:
                nn_epbase_clear_error (atcp->epbase);

                /*  Set the relevant socket options. */
                sz = sizeof (val);
                nn_epbase_getopt (atcp->epbase, NN_SOL_SOCKET, NN_SNDBUF,
                    &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&atcp->usock, SOL_SOCKET, SO_SNDBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_epbase_getopt (atcp->epbase, NN_SOL_SOCKET, NN_RCVBUF,
                    &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&atcp->usock, SOL_SOCKET, SO_RCVBUF,
                    &val, sizeof (val));

                /*  Return ownership of the listening socket to the parent. */
                nn_usock_swap_owner (atcp->listener, &atcp->listener_owner);
                atcp->listener = NULL;
                atcp->listener_owner.src = -1;
                atcp->listener_owner.fsm = NULL;
                nn_fsm_raise (&atcp->fsm, &atcp->accepted, NN_ATCP_ACCEPTED);

                /*  Start the stcp state machine. */
                nn_usock_activate (&atcp->usock);
                nn_stcp_start (&atcp->stcp, &atcp->usock);
                atcp->state = NN_ATCP_STATE_ACTIVE;

                nn_epbase_stat_increment (atcp->epbase,
                    NN_STAT_ACCEPTED_CONNECTIONS, 1);

                return;

            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        case NN_ATCP_SRC_LISTENER:
            switch (type) {

            case NN_USOCK_ACCEPT_ERROR:
                nn_epbase_set_error (atcp->epbase,
                    nn_usock_geterrno(atcp->listener));
                nn_epbase_stat_increment (atcp->epbase,
                    NN_STAT_ACCEPT_ERRORS, 1);
                nn_usock_accept (&atcp->usock, atcp->listener);
                return;

            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_ATCP_STATE_ACTIVE:
        switch (src) {

        case NN_ATCP_SRC_STCP:
            switch (type) {
            case NN_STCP_ERROR:
                nn_stcp_stop (&atcp->stcp);
                atcp->state = NN_ATCP_STATE_STOPPING_STCP;
                nn_epbase_stat_increment (atcp->epbase,
                    NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_STCP state.                                                      */
/******************************************************************************/
    case NN_ATCP_STATE_STOPPING_STCP:
        switch (src) {

        case NN_ATCP_SRC_STCP:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_STCP_STOPPED:
                nn_usock_stop (&atcp->usock);
                atcp->state = NN_ATCP_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                      */
/******************************************************************************/
    case NN_ATCP_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_ATCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_fsm_raise (&atcp->fsm, &atcp->done, NN_ATCP_ERROR);
                atcp->state = NN_ATCP_STATE_DONE;
                return;
            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (atcp->state, src, type);
    }
}